

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  uVar3 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar5 = *(ushort *)(puVar2 + uVar3 + 1) << 8 | *(ushort *)(puVar2 + uVar3 + 1) >> 8;
  uVar1 = pPg->pBt->usableSize;
  iVar6 = uVar1 - nByte;
  uVar7 = uVar3 + 1;
  while( true ) {
    uVar11 = (ulong)uVar5;
    uVar9 = (uint)uVar5;
    if (iVar6 < (int)uVar9) {
      if ((int)uVar9 <= (int)(uVar1 - 4)) {
        return (u8 *)0x0;
      }
      uVar4 = 0xfd09;
      goto LAB_0015147f;
    }
    uVar8 = *(ushort *)(puVar2 + uVar11 + 2) << 8 | *(ushort *)(puVar2 + uVar11 + 2) >> 8;
    iVar10 = (uint)uVar8 - nByte;
    if (-1 < iVar10) break;
    uVar5 = *(ushort *)(puVar2 + uVar11) << 8 | *(ushort *)(puVar2 + uVar11) >> 8;
    uVar7 = uVar11;
    if ((uint)uVar5 <= uVar8 + uVar9) {
      if (uVar5 != 0) {
        uVar4 = 0xfd02;
LAB_0015147f:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar4,
                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
        *pRc = 0xb;
      }
      return (u8 *)0x0;
    }
  }
  if (iVar10 < 4) {
    if (0x39 < puVar2[uVar3 + 7]) {
      return (u8 *)0x0;
    }
    *(undefined2 *)(puVar2 + uVar7) = *(undefined2 *)(puVar2 + uVar11);
    puVar2[uVar3 + 7] = puVar2[uVar3 + 7] + (char)iVar10;
  }
  else {
    if (iVar6 < (int)(iVar10 + uVar9)) {
      uVar4 = 0xfcf4;
      goto LAB_0015147f;
    }
    *(ushort *)(puVar2 + uVar11 + 2) = (ushort)iVar10 << 8 | (ushort)iVar10 >> 8;
  }
  return puVar2 + (iVar10 + uVar9);
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;            /* Offset to page header */
  u8 * const aData = pPg->aData;             /* Page data */
  int iAddr = hdr + 1;                       /* Address of ptr to pc */
  int pc = get2byte(&aData[iAddr]);          /* Address of a free slot */
  int x;                                     /* Excess size of the slot */
  int maxPC = pPg->pBt->usableSize - nByte;  /* Max address for a usable slot */
  int size;                                  /* Size of the free slot */

  assert( pc>0 );
  while( pc<=maxPC ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else if( x+pc > maxPC ){
        /* This slot extends off the end of the usable part of the page */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
        ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
    if( pc<=iAddr+size ){
      if( pc ){
        /* The next slot in the chain is not past the end of the current slot */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
      }
      return 0;
    }
  }
  if( pc>maxPC+nByte-4 ){
    /* The free slot chain extends off the end of the page */
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }
  return 0;
}